

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall google::protobuf::Symbol::GetFile(Symbol *this)

{
  FileDescriptor *pFVar1;
  FileDescriptor *pFVar2;
  
  pFVar1 = (FileDescriptor *)this->ptr_;
  pFVar2 = (FileDescriptor *)0x0;
  switch((pFVar1->super_SymbolBase).symbol_type_) {
  case '\x01':
    return (FileDescriptor *)pFVar1->pool_;
  case '\x02':
  case '\x04':
  case '\a':
    return (FileDescriptor *)pFVar1->package_;
  case '\x03':
    return *(FileDescriptor **)((long)&pFVar1->package_->field_2 + 8);
  case '\x05':
  case '\b':
    return (FileDescriptor *)(pFVar1->package_->field_2)._M_allocated_capacity;
  case '\t':
    return pFVar1;
  case '\n':
    pFVar2 = (FileDescriptor *)pFVar1->name_;
  }
  return pFVar2;
}

Assistant:

Type type() const { return static_cast<Type>(ptr_->symbol_type_); }